

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O3

BinarySink * get_out_val_string_binarysink(BinarySource *in)

{
  Value *pVVar1;
  strbuf *psVar2;
  finaliser *pfVar3;
  
  pVVar1 = value_new(VT_string);
  psVar2 = strbuf_new();
  (pVVar1->field_2).vu_string = psVar2;
  pfVar3 = (finaliser *)safegrowarray(finalisers,&finalisersize,0x10,nfinalisers,1,false);
  finalisers = pfVar3;
  pfVar3[nfinalisers].fn = finaliser_return_value;
  pfVar3[nfinalisers].ctx = pVVar1;
  nfinalisers = nfinalisers + 1;
  return ((pVVar1->field_2).vu_string)->binarysink_;
}

Assistant:

static BinarySink *get_out_val_string_binarysink(BinarySource *in)
{
    Value *val = value_new(VT_string);
    val->vu_string = strbuf_new();
    add_finaliser(finaliser_return_value, val);
    return BinarySink_UPCAST(val->vu_string);
}